

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.hpp
# Opt level: O2

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_>::~TimeCorrFunc
          (TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_> *this)

{
  DumpReader *this_00;
  
  (this->super_DynamicProperty)._vptr_DynamicProperty = (_func_int **)&PTR__TimeCorrFunc_002b7d30;
  this_00 = this->reader_;
  if (this_00 != (DumpReader *)0x0) {
    DumpReader::~DumpReader(this_00);
  }
  operator_delete(this_00,0x1258);
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            (&this->progressBar_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->selection2StartFrame_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->selection1StartFrame_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->GIDtoSele2_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->GIDtoSele1_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->sele2ToIndex_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->sele1ToIndex_);
  std::__cxx11::string::~string((string *)&this->labelString_);
  std::__cxx11::string::~string((string *)&this->paramString_);
  std::__cxx11::string::~string((string *)&this->corrFuncType_);
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator2_);
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator1_);
  std::__cxx11::string::~string((string *)&this->selectionScript2_);
  std::__cxx11::string::~string((string *)&this->selectionScript1_);
  SelectionManager::~SelectionManager(&this->seleMan2_);
  SelectionManager::~SelectionManager(&this->seleMan1_);
  std::__cxx11::string::~string((string *)&this->dumpFilename_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->times_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->count_).super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<OpenMD::DynamicVector<double,_std::allocator<double>_>,_std::allocator<OpenMD::DynamicVector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->histogram_);
  DynamicProperty::~DynamicProperty(&this->super_DynamicProperty);
  return;
}

Assistant:

virtual ~TimeCorrFunc() { delete reader_; }